

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O3

Vec_Wec_t * Str_ManDeriveTrees(Gia_Man_t *p)

{
  byte *pbVar1;
  uint *puVar2;
  Gia_Obj_t *pGVar3;
  long lVar4;
  Vec_Str_t *vStr;
  char *pcVar5;
  Abc_Nam_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Int_t *pVVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  Gia_Obj_t *pGVar14;
  int fFound;
  int local_3c;
  Vec_Str_t *local_38;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x171,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  uVar10 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      puVar2 = p->pMuxes;
      if ((puVar2 != (uint *)0x0) && (puVar2[lVar7] != 0)) {
        pGVar3 = p->pObjs;
        uVar11 = *(undefined8 *)(&pGVar3->field_0x0 + lVar4);
        uVar12 = (uint)uVar11 & 0x1fffffff;
        uVar9 = (ulong)(uVar12 * 4);
        pGVar14 = (Gia_Obj_t *)(lVar4 + uVar9 * -3 + (long)pGVar3);
        if ((pGVar14 < pGVar3) || (pGVar3 + (int)uVar10 <= pGVar14)) {
LAB_00728947:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar8 = (int)(lVar4 + (ulong)(uVar12 << 2) * -3 >> 2) * -0x55555555;
        pGVar14 = pGVar3;
        if ((puVar2[iVar8] != 0) && (p->pRefs[iVar8] == 1)) {
          pbVar1 = (byte *)((long)pGVar3 + lVar4 + uVar9 * -3 + 3);
          *pbVar1 = *pbVar1 | 0x40;
          uVar11 = *(undefined8 *)(&pGVar3->field_0x0 + lVar4);
          pGVar14 = p->pObjs;
        }
        uVar12 = (uint)((ulong)uVar11 >> 0x20) & 0x1fffffff;
        uVar9 = (ulong)(uVar12 * 4);
        pGVar13 = (Gia_Obj_t *)(lVar4 + uVar9 * -3 + (long)pGVar3);
        if ((pGVar13 < pGVar14) || (uVar10 = (ulong)p->nObjs, pGVar14 + uVar10 <= pGVar13))
        goto LAB_00728947;
        if (((p->pMuxes != (uint *)0x0) &&
            (iVar8 = (int)((long)pGVar3 + lVar4 + ((ulong)(uVar12 << 2) * -3 - (long)pGVar14) >> 2)
                     * -0x55555555, p->pMuxes[iVar8] != 0)) && (p->pRefs[iVar8] == 1)) {
          pbVar1 = (byte *)((long)pGVar3 + lVar4 + uVar9 * -3 + 3);
          *pbVar1 = *pbVar1 | 0x40;
          uVar10 = (ulong)(uint)p->nObjs;
        }
      }
      lVar7 = lVar7 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar7 < (int)uVar10);
  }
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  vStr->pArray = pcVar5;
  p_00 = Abc_NamStart(10000,0x32);
  p_01 = (Vec_Wec_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  pVVar6 = (Vec_Int_t *)calloc(1000,0x10);
  p_01->pArray = pVVar6;
  Vec_WecPushLevel(p_01);
  iVar8 = p->nObjs;
  if (0 < iVar8) {
    lVar7 = 0;
    lVar4 = 0;
    local_38 = vStr;
    do {
      if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar4] != 0)) {
        pGVar3 = p->pObjs;
        uVar12 = (uint)*(ulong *)(&pGVar3->field_0x0 + lVar7);
        if (((uVar12 >> 0x1e & 1) == 0) &&
           (((*(byte *)((long)pGVar3 + lVar7 + (ulong)((uVar12 & 0x1fffffff) << 2) * -3 + 3) & 0x40)
             != 0 || ((*(byte *)((long)pGVar3 +
                                lVar7 + (ulong)((uint)(*(ulong *)(&pGVar3->field_0x0 + lVar7) >>
                                                      0x1e) & 0x7ffffffc) * -3 + 3) & 0x40) != 0))))
        {
          Str_MuxStructDump(p,(Gia_Obj_t *)(&pGVar3->field_0x0 + lVar7),vStr);
          uVar12 = Abc_NamStrFindOrAdd(p_00,vStr->pArray,&local_3c);
          if (local_3c == 0) {
            Vec_WecPushLevel(p_01);
          }
          iVar8 = Abc_NamObjNumMax(p_00);
          if (iVar8 != p_01->nSize) {
            __assert_fail("Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                          ,0x191,"Vec_Wec_t *Str_ManDeriveTrees(Gia_Man_t *)");
          }
          if (((int)uVar12 < 0) || (iVar8 <= (int)uVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(p_01->pArray + uVar12,(int)lVar4);
          iVar8 = p->nObjs;
          vStr = local_38;
        }
      }
      lVar4 = lVar4 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar4 < iVar8);
  }
  Abc_NamStop(p_00);
  if (vStr->pArray != (char *)0x0) {
    free(vStr->pArray);
  }
  free(vStr);
  return p_01;
}

Assistant:

Vec_Wec_t * Str_ManDeriveTrees( Gia_Man_t * p )
{
    int fPrintStructs = 0;
    Abc_Nam_t * pNames; 
    Vec_Wec_t * vGroups;  
    Vec_Str_t * vStr;
    Gia_Obj_t * pObj, * pFanin;
    int i, iStructId, fFound;
    assert( p->pMuxes != NULL );
    // mark MUXes whose only fanout is a MUX
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    Gia_ManForEachMuxId( p, i )
    {
        pObj = Gia_ManObj(p, i);
        pFanin = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
        pFanin = Gia_ObjFanin1(pObj);
        if ( Gia_ObjIsMux(p, pFanin) && Gia_ObjRefNum(p, pFanin) == 1 )
            pFanin->fMark0 = 1;
    }
    // traverse for top level MUXes
    vStr   = Vec_StrAlloc( 1000 );
    pNames = Abc_NamStart( 10000, 50 );
    vGroups = Vec_WecAlloc( 1000 );
    Vec_WecPushLevel( vGroups );
    Gia_ManForEachMuxId( p, i )
    {
        // skip internal
        pObj = Gia_ManObj(p, i);
        if ( pObj->fMark0 )
            continue;
        // skip trees of size one
        if ( !Gia_ObjFanin0(pObj)->fMark0 && !Gia_ObjFanin1(pObj)->fMark0 )
            continue;
        // hash the tree
        Str_MuxStructDump( p, pObj, vStr );
        iStructId = Abc_NamStrFindOrAdd( pNames, Vec_StrArray(vStr), &fFound );
        if ( !fFound ) Vec_WecPushLevel( vGroups );
        assert( Abc_NamObjNumMax(pNames) == Vec_WecSize(vGroups) );
        Vec_IntPush( Vec_WecEntry(vGroups, iStructId), i );
    }
    if ( fPrintStructs )
    {
        char * pTemp; 
        Abc_NamManForEachObj( pNames, pTemp, i )
        {
            printf( "%5d : ", i );
            printf( "Occur = %4d   ", Vec_IntSize(Vec_WecEntry(vGroups,i)) );
            printf( "Size = %4d   ",  Str_ManMuxCountOne(pTemp) );
            printf( "%s\n", pTemp );
        }
    }
    Abc_NamStop( pNames );
    Vec_StrFree( vStr );
    return vGroups;
}